

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O2

void test_decimal128_to_string__regular(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char bid_string [43];
  bson_decimal128_t full_house;
  bson_decimal128_t all_digits;
  bson_decimal128_t trailing_zeros;
  bson_decimal128_t largest_regular;
  bson_decimal128_t smallest_regular;
  bson_decimal128_t tenth;
  bson_decimal128_t negative_zero;
  bson_decimal128_t negative_one;
  bson_decimal128_t two;
  bson_decimal128_t zero;
  bson_decimal128_t one;
  
  one.high = 0x3040000000000000;
  zero.high = 0x3040000000000000;
  zero.low = 0;
  one.low = 1;
  two.high = 0x3040000000000000;
  two.low = 2;
  negative_one.high = 0xb040000000000000;
  negative_one.low = 1;
  negative_zero.high = 0xb040000000000000;
  negative_zero.low = 0;
  tenth.high = 0x303e000000000000;
  tenth.low = 1;
  smallest_regular.high = 0x3034000000000000;
  smallest_regular.low = 0x4d2;
  largest_regular.high = 0x3040000000000000;
  largest_regular.low = 0x1cbe991a14;
  trailing_zeros.high = 0x302a000000000000;
  trailing_zeros.low = 0x75aef40;
  all_digits.high = 0x2ffc3cde6fff9732;
  all_digits.low = 0xde825cd07e96aff2;
  full_house.high = 0x3040ffffffffffff;
  full_house.low = 0xffffffffffffffff;
  bson_decimal128_to_string(&one,bid_string);
  if (bid_string._0_2_ == 0x31) {
    bson_decimal128_to_string(&zero,bid_string);
    if (bid_string._0_2_ == 0x30) {
      bson_decimal128_to_string(&two,bid_string);
      if (bid_string._0_2_ == 0x32) {
        bson_decimal128_to_string(&negative_one,bid_string);
        iVar1 = bcmp("-1",bid_string,3);
        if (iVar1 == 0) {
          bson_decimal128_to_string(&negative_zero,bid_string);
          iVar1 = bcmp("-0",bid_string,3);
          if (iVar1 == 0) {
            bson_decimal128_to_string(&tenth,bid_string);
            if (bid_string._0_4_ == 0x312e30) {
              bson_decimal128_to_string(&smallest_regular,bid_string);
              iVar1 = bcmp("0.001234",bid_string,9);
              if (iVar1 == 0) {
                bson_decimal128_to_string(&largest_regular,bid_string);
                iVar1 = bcmp("123456789012",bid_string,0xd);
                if (iVar1 == 0) {
                  bson_decimal128_to_string(&trailing_zeros,bid_string);
                  iVar1 = bcmp("0.00123400000",bid_string,0xe);
                  if (iVar1 == 0) {
                    bson_decimal128_to_string(&all_digits,bid_string);
                    iVar1 = bcmp("0.1234567890123456789012345678901234",bid_string,0x25);
                    if (iVar1 == 0) {
                      bson_decimal128_to_string(&full_house,bid_string);
                      iVar1 = bcmp("5192296858534827628530496329220095",bid_string,0x23);
                      if (iVar1 == 0) {
                        return;
                      }
                      pcVar3 = "!strcmp (\"5192296858534827628530496329220095\", bid_string)";
                      uVar2 = 0xa9;
                    }
                    else {
                      pcVar3 = "!strcmp (\"0.1234567890123456789012345678901234\", bid_string)";
                      uVar2 = 0xa6;
                    }
                  }
                  else {
                    pcVar3 = "!strcmp (\"0.00123400000\", bid_string)";
                    uVar2 = 0xa3;
                  }
                }
                else {
                  pcVar3 = "!strcmp (\"123456789012\", bid_string)";
                  uVar2 = 0xa0;
                }
              }
              else {
                pcVar3 = "!strcmp (\"0.001234\", bid_string)";
                uVar2 = 0x9d;
              }
            }
            else {
              pcVar3 = "!strcmp (\"0.1\", bid_string)";
              uVar2 = 0x9a;
            }
          }
          else {
            pcVar3 = "!strcmp (\"-0\", bid_string)";
            uVar2 = 0x97;
          }
        }
        else {
          pcVar3 = "!strcmp (\"-1\", bid_string)";
          uVar2 = 0x94;
        }
      }
      else {
        pcVar3 = "!strcmp (\"2\", bid_string)";
        uVar2 = 0x91;
      }
    }
    else {
      pcVar3 = "!strcmp (\"0\", bid_string)";
      uVar2 = 0x8e;
    }
  }
  else {
    pcVar3 = "!strcmp (\"1\", bid_string)";
    uVar2 = 0x8b;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
          ,uVar2,"test_decimal128_to_string__regular",pcVar3);
  abort();
}

Assistant:

static void
test_decimal128_to_string__regular (void)
{
   char bid_string[BSON_DECIMAL128_STRING];
   bson_decimal128_t one;
   bson_decimal128_t zero;
   bson_decimal128_t two;
   bson_decimal128_t negative_one;
   bson_decimal128_t negative_zero;
   bson_decimal128_t tenth;
   bson_decimal128_t smallest_regular;
   bson_decimal128_t largest_regular;
   bson_decimal128_t trailing_zeros;
   bson_decimal128_t all_digits;
   bson_decimal128_t full_house;

   DECIMAL128_FROM_ULLS (one, 0x3040000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (zero, 0x3040000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (two, 0x3040000000000000, 0x0000000000000002);
   DECIMAL128_FROM_ULLS (negative_one, 0xb040000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (negative_zero, 0xb040000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (
      tenth, 0x303e000000000000, 0x0000000000000001); /* 0.1 */
   /* 0.001234 */
   DECIMAL128_FROM_ULLS (
      smallest_regular, 0x3034000000000000, 0x00000000000004d2);
   /* 12345789012 */
   DECIMAL128_FROM_ULLS (
      largest_regular, 0x3040000000000000, 0x0000001cbe991a14);
   /* 0.00123400000 */
   DECIMAL128_FROM_ULLS (
      trailing_zeros, 0x302a000000000000, 0x00000000075aef40);
   /* 0.1234567890123456789012345678901234 */
   DECIMAL128_FROM_ULLS (all_digits, 0x2ffc3cde6fff9732, 0xde825cd07e96aff2);

   /* 5192296858534827628530496329220095 */
   DECIMAL128_FROM_ULLS (full_house, 0x3040ffffffffffff, 0xffffffffffffffff);

   bson_decimal128_to_string (&one, bid_string);
   BSON_ASSERT (!strcmp ("1", bid_string));

   bson_decimal128_to_string (&zero, bid_string);
   BSON_ASSERT (!strcmp ("0", bid_string));

   bson_decimal128_to_string (&two, bid_string);
   BSON_ASSERT (!strcmp ("2", bid_string));

   bson_decimal128_to_string (&negative_one, bid_string);
   BSON_ASSERT (!strcmp ("-1", bid_string));

   bson_decimal128_to_string (&negative_zero, bid_string);
   BSON_ASSERT (!strcmp ("-0", bid_string));

   bson_decimal128_to_string (&tenth, bid_string);
   BSON_ASSERT (!strcmp ("0.1", bid_string));

   bson_decimal128_to_string (&smallest_regular, bid_string);
   BSON_ASSERT (!strcmp ("0.001234", bid_string));

   bson_decimal128_to_string (&largest_regular, bid_string);
   BSON_ASSERT (!strcmp ("123456789012", bid_string));

   bson_decimal128_to_string (&trailing_zeros, bid_string);
   BSON_ASSERT (!strcmp ("0.00123400000", bid_string));

   bson_decimal128_to_string (&all_digits, bid_string);
   BSON_ASSERT (!strcmp ("0.1234567890123456789012345678901234", bid_string));

   bson_decimal128_to_string (&full_house, bid_string);
   BSON_ASSERT (!strcmp ("5192296858534827628530496329220095", bid_string));
}